

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O2

int dmrC_test_allocator(void)

{
  allocation_blob *paVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  int iVar5;
  void **p;
  void **p_1;
  undefined1 auStack_a8 [8];
  allocator alloc2;
  allocator local_60;
  
  local_60.name_ = "foo";
  local_60.blobs_ = (allocation_blob *)0x0;
  local_60.size_ = 8;
  local_60.alignment_ = 4;
  local_60.chunking_ = 0x28;
  local_60.freelist_ = (void *)0x0;
  local_60.allocations = 0;
  local_60.total_bytes = 0;
  local_60.useful_bytes = 0;
  plVar2 = (long *)dmrC_allocator_allocate(&local_60,0);
  iVar5 = 1;
  if ((((plVar2 != (long *)0x0) && (local_60.alignment_ == 4)) && (local_60.allocations == 1)) &&
     (local_60.freelist_ == (void *)0x0)) {
    plVar3 = (long *)dmrC_allocator_allocate(&local_60,0);
    if (plVar3 == plVar2 + 1) {
      *plVar2 = (long)local_60.freelist_;
      *plVar3 = (long)plVar2;
      local_60.freelist_ = plVar3;
      plVar4 = (long *)dmrC_allocator_allocate(&local_60,0);
      if (plVar4 == plVar3) {
        plVar3 = (long *)dmrC_allocator_allocate(&local_60,0);
        if (plVar3 == plVar2) {
          dmrC_allocator_allocate(&local_60,0);
          paVar1 = local_60.blobs_;
          if (local_60.total_bytes == 0x50) {
            alloc2.allocations = 0;
            alloc2.total_bytes = 0;
            alloc2.alignment_ = 0;
            alloc2.chunking_ = 0;
            alloc2.freelist_ = (void *)0x0;
            alloc2.blobs_ = (allocation_blob *)0x0;
            alloc2.size_ = 0;
            auStack_a8 = (undefined1  [8])0x0;
            alloc2.name_ = (char *)0x0;
            dmrC_allocator_transfer(&local_60,(allocator *)auStack_a8);
            iVar5 = 1;
            if ((local_60.blobs_ == (allocation_blob *)0x0) &&
               ((allocation_blob *)alloc2.name_ == paVar1)) {
              dmrC_allocator_destroy((allocator *)auStack_a8);
              puts("allocator tests okay");
              iVar5 = 0;
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int dmrC_test_allocator() {
  struct allocator alloc;
  dmrC_allocator_init(&alloc, "foo", sizeof(struct foo), __alignof__(struct foo),
                 sizeof(struct allocation_blob) + sizeof(struct foo) * 2);
  struct foo *t1 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  if (t1 == NULL)
    return 1;
  if (alloc.alignment_ != __alignof__(struct foo))
    return 1;
  if (alloc.allocations != 1)
    return 1;
  if (alloc.freelist_ != NULL)
    return 1;
  struct foo *t2 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  if (t2 != t1 + 1)
    return 1;
  //dmrC_allocator_show_allocations(&alloc);
  dmrC_allocator_free(&alloc, t1);
  dmrC_allocator_free(&alloc, t2);
  struct foo *t3 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  if (t3 != t2)
    return 1;
  struct foo *t4 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  if (t4 != t1)
    return 1;
  struct foo *t5 = (struct foo *)dmrC_allocator_allocate(&alloc, 0);
  (void)t5;
  if (alloc.total_bytes !=
      (sizeof(struct allocation_blob) + sizeof(struct foo) * 2) * 2)
    return 1;
  struct allocator alloc2;
  memset(&alloc2, 0, sizeof alloc2);
  struct allocation_blob *saved = alloc.blobs_;
  dmrC_allocator_transfer(&alloc, &alloc2);
  if (alloc.blobs_ != NULL)
	  return 1;
  if (alloc2.blobs_ != saved)
	  return 1;
  dmrC_allocator_destroy(&alloc2);
  printf("allocator tests okay\n");
  return 0;
}